

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

void map_iterate(map m,map_cb_iterate iterate_cb,map_cb_iterate_args args)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bucket pbVar5;
  
  if (((m != (map)0x0) && (iterate_cb != (map_cb_iterate)0x0)) && (m->buckets != (bucket)0x0)) {
    for (uVar2 = 0; uVar2 < m->capacity; uVar2 = uVar2 + 1) {
      if ((m->buckets[uVar2].pairs != (pair)0x0) &&
         (pbVar5 = m->buckets + uVar2, pbVar5->count != 0)) {
        uVar4 = 0xffffffffffffffff;
        lVar3 = 8;
        while (uVar4 = uVar4 + 1, uVar4 < pbVar5->count) {
          iVar1 = (*iterate_cb)(m,*(map_key *)((long)pbVar5->pairs + lVar3 + -8),
                                *(map_value *)((long)&pbVar5->pairs->key + lVar3),args);
          lVar3 = lVar3 + 0x10;
          if (iVar1 != 0) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void map_iterate(map m, map_cb_iterate iterate_cb, map_cb_iterate_args args)
{
	if (m != NULL && m->buckets != NULL && iterate_cb != NULL)
	{
		size_t bucket_iterator;

		for (bucket_iterator = 0; bucket_iterator < m->capacity; ++bucket_iterator)
		{
			bucket b = &m->buckets[bucket_iterator];

			if (b->pairs != NULL && b->count > 0)
			{
				size_t pair_iterator;

				for (pair_iterator = 0; pair_iterator < b->count; ++pair_iterator)
				{
					pair p = &b->pairs[pair_iterator];

					if (iterate_cb(m, p->key, p->value, args) != 0)
					{
						return;
					}
				}
			}
		}
	}
}